

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

int __kmp_api_omp_get_thread_limit_(void)

{
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  return __kmp_cg_max_nth;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_THREAD_LIMIT)(void) {
#ifdef KMP_STUB
  return 1; // TO DO: clarify whether it returns 1 or 0?
#else
  if (!__kmp_init_serial) {
    __kmp_serial_initialize();
  }
  /* global ICV */
  return __kmp_cg_max_nth;
#endif
}